

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

__pid_t __thiscall kj::EventLoop::wait(EventLoop *this,void *__stat_loc)

{
  EventPort *pEVar1;
  Executor *pEVar2;
  int iVar3;
  __pid_t _Var4;
  byte bVar5;
  undefined8 in_RCX;
  nfds_t in_RDX;
  nfds_t __nfds;
  Fault f;
  Fault local_10;
  
  if (this->wouldSleepHead != (Event *)0x0) {
    iVar3 = poll(this,(pollfd *)__stat_loc,in_RDX,(int)in_RCX);
    return iVar3;
  }
  pEVar1 = (this->port).ptr;
  if (pEVar1 != (EventPort *)0x0) {
    iVar3 = (**pEVar1->_vptr_EventPort)();
    pEVar2 = (this->executor).ptr.ptr;
    bVar5 = pEVar2 != (Executor *)0x0 & (byte)iVar3;
    if (bVar5 == 1) {
      iVar3 = Executor::poll(pEVar2,(pollfd *)__stat_loc,__nfds,
                             (int)CONCAT71((int7)((ulong)in_RCX >> 8),bVar5));
      return iVar3;
    }
    return iVar3;
  }
  pEVar2 = (this->executor).ptr.ptr;
  if (pEVar2 != (Executor *)0x0) {
    _Var4 = Executor::wait(pEVar2,__stat_loc);
    return _Var4;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[53]>
            (&local_10,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x769,FAILED,(char *)0x0,"\"Nothing to wait for; this thread would hang forever.\"",
             (char (*) [53])"Nothing to wait for; this thread would hang forever.");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

void EventLoop::wait() {
  if (wouldSleepHead != nullptr) {
    // Oh, someone wants to know when we are going to sleep. Use poll() instead so that we don't
    // actually sleep. poll() will queue the would-sleep waiter if needed.
    poll();
    return;
  }

  KJ_IF_SOME(p, port) {
    if (p.wait()) {
      // Another thread called wake(). Check for cross-thread events.
      KJ_IF_SOME(e, executor) {
        e->poll();
      }
    }
  } else KJ_IF_SOME(e, executor) {
    e->wait();
  } else {
    KJ_FAIL_REQUIRE("Nothing to wait for; this thread would hang forever.");
  }
}